

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::piece_picker::shuffle(piece_picker *this,int priority,prio_index_t elem_index)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  value_type *__b;
  piece_pos *p2;
  piece_pos *p1;
  int local_2c;
  strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void> local_28;
  strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void> sStack_24;
  prio_index_t other_index;
  pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>
  range;
  int priority_local;
  piece_picker *this_local;
  prio_index_t elem_index_local;
  
  this_local._4_4_ = elem_index.m_val;
  _sStack_24 = priority_range(this,priority);
  local_2c = (int)aux::operator-(other_index.m_val,sStack_24);
  iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_2c);
  uVar3 = numeric_cast<unsigned_int,int,void>(iVar2 + -1);
  lVar4 = random((aux *)(ulong)uVar3);
  iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)&stack0xffffffffffffffdc);
  strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>::strong_typedef
            (&local_28,(int)lVar4 + iVar2);
  bVar1 = strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>::operator==
                    (&local_28,
                     (strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void> *)
                     ((long)&this_local + 4));
  if (!bVar1) {
    pvVar5 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
             ::operator[](&this->m_pieces,local_28);
    pvVar6 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
             ::operator[](&this->m_piece_map,
                          (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)pvVar5->m_val
                         );
    pvVar5 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
             ::operator[](&this->m_pieces,
                          (strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>)
                          this_local._4_4_);
    pvVar7 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
             ::operator[](&this->m_piece_map,
                          (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)pvVar5->m_val
                         );
    ::std::swap<libtorrent::aux::strong_typedef<int,libtorrent::aux::prio_index_tag_t,void>>
              (&pvVar6->index,&pvVar7->index);
    pvVar5 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
             ::operator[](&this->m_pieces,local_28);
    __b = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
          ::operator[](&this->m_pieces,
                       (strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>)
                       this_local._4_4_);
    ::std::swap<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
              (pvVar5,__b);
  }
  return;
}

Assistant:

void piece_picker::shuffle(int const priority, prio_index_t const elem_index)
	{
#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "shuffle()" << std::endl;
#endif

		TORRENT_ASSERT(!m_dirty);
		TORRENT_ASSERT(priority >= 0);
		TORRENT_ASSERT(elem_index >= prio_index_t(0));
		TORRENT_ASSERT(elem_index < m_pieces.end_index());
		TORRENT_ASSERT(m_piece_map[m_pieces[elem_index]].priority(this) == priority);

		auto const range = priority_range(priority);
		prio_index_t const other_index(
			int(random(aux::numeric_cast<std::uint32_t>(static_cast<int>(range.second - range.first) - 1)))
			+ static_cast<int>(range.first));

		if (other_index == elem_index) return;

		// swap other_index with elem_index
		piece_pos& p1 = m_piece_map[m_pieces[other_index]];
		piece_pos& p2 = m_piece_map[m_pieces[elem_index]];

		std::swap(p1.index, p2.index);
		std::swap(m_pieces[other_index], m_pieces[elem_index]);
	}